

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_d974ef::TargetIncludeDirectoriesImpl::HandleMissingTarget
          (TargetIncludeDirectoriesImpl *this,string *name)

{
  cmMakefile *this_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string local_60;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  size_type local_30;
  pointer local_28;
  undefined8 local_20;
  char *local_18;
  
  this_00 = (this->super_cmTargetPropCommandBase).Makefile;
  local_28 = (name->_M_dataplus)._M_p;
  local_30 = name->_M_string_length;
  local_40._M_len = 0x2f;
  local_40._M_str = "Cannot specify include directories for target \"";
  local_20 = 0x25;
  local_18 = "\" which is not built by this project.";
  views._M_len = 3;
  views._M_array = &local_40;
  cmCatViews_abi_cxx11_(&local_60,views);
  cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void HandleMissingTarget(const std::string& name) override
  {
    this->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      cmStrCat("Cannot specify include directories for target \"", name,
               "\" which is not built by this project."));
  }